

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O2

bool __thiscall
kainjow::mustache::
basic_mustache<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
::render_lambda(basic_mustache<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                *this,render_handler *handler,
               basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
               *var,context_internal<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                    *ctx,render_lambda_escape escape,string_type *text,bool parse_with_same_context)

{
  size_type sVar1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *this_00;
  basic_renderer<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  renderer;
  type2 render2;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_b0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_90;
  _Any_data local_70;
  undefined8 local_60;
  code *local_58;
  _Function_base local_50;
  
  local_60 = (code *)CONCAT71(local_60._1_7_,parse_with_same_context);
  local_60 = (code *)CONCAT44(escape,(undefined4)local_60);
  local_70._M_unused._M_object = this;
  local_70._8_8_ = ctx;
  std::function<std::__cxx11::wstring(std::__cxx11::wstring_const&,bool)>::
  function<kainjow::mustache::basic_mustache<std::__cxx11::wstring>::render_lambda(std::function<void(std::__cxx11::wstring_const&)>const&,kainjow::mustache::basic_data<std::__cxx11::wstring>const*,kainjow::mustache::context_internal<std::__cxx11::wstring>&,kainjow::mustache::basic_mustache<std::__cxx11::wstring>::render_lambda_escape,std::__cxx11::wstring_const&,bool)::_lambda(std::__cxx11::wstring_const&,bool)_1_,void>
            ((function<std::__cxx11::wstring(std::__cxx11::wstring_const&,bool)> *)&local_50,
             (anon_class_24_4_a93b1dce *)&local_70);
  local_70._8_8_ = 0;
  local_58 = Catch::clara::std::
             _Function_handler<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_(const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/mustache.hpp:1103:68)>
             ::_M_invoke;
  local_60 = Catch::clara::std::
             _Function_handler<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_(const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/mustache.hpp:1103:68)>
             ::_M_manager;
  local_70._M_unused._M_object = &local_50;
  if (var->type_ == lambda2) {
    local_90._M_dataplus._M_p = (pointer)&local_70;
    local_90._M_string_length = (size_type)&local_50;
    Catch::clara::std::
    function<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_(const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_&)>
    ::operator()(&local_b0,
                 (function<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_(const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_&)>
                  *)(((var->lambda_)._M_t.
                      super___uniq_ptr_impl<kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::default_delete<kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::default_delete<kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                      .
                      super__Head_base<0UL,_kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_false>
                     ._M_head_impl)->type2_)._M_t.
                    super___uniq_ptr_impl<std::function<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_(const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_&)>,_std::default_delete<std::function<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_(const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_&)>_>_>
                 ,text,(basic_renderer<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                        *)&local_90);
    std::__cxx11::wstring::append((wstring *)&ctx->line_buffer);
    this_00 = &local_b0;
  }
  else {
    render_current_line(this,handler,ctx,
                        (component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                         *)0x0);
    Catch::clara::std::
    function<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_(const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&)>
    ::operator()(&local_90,
                 (function<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_(const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&)>
                  *)(((var->lambda_)._M_t.
                      super___uniq_ptr_impl<kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::default_delete<kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::default_delete<kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                      .
                      super__Head_base<0UL,_kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_false>
                     ._M_head_impl)->type1_)._M_t,text);
    Catch::clara::std::
    function<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_(const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&)>
    ::operator()(&local_b0,
                 (function<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_(const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&)>
                  *)&local_70,&local_90);
    std::__cxx11::wstring::append((wstring *)&ctx->line_buffer);
    std::__cxx11::wstring::~wstring((wstring *)&local_b0);
    this_00 = &local_90;
  }
  std::__cxx11::wstring::~wstring((wstring *)this_00);
  sVar1 = (this->error_message_)._M_string_length;
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_70);
  Catch::clara::std::_Function_base::~_Function_base(&local_50);
  return sVar1 == 0;
}

Assistant:

bool render_lambda(const render_handler& handler, const basic_data<string_type>* var, context_internal<string_type>& ctx, render_lambda_escape escape, const string_type& text, bool parse_with_same_context) {
        const typename basic_renderer<string_type>::type2 render2 = [this, &ctx, parse_with_same_context, escape](const string_type& text, bool escaped) {
            const auto process_template = [this, &ctx, escape, escaped](basic_mustache& tmpl) -> string_type {
                if (!tmpl.is_valid()) {
                    error_message_ = tmpl.error_message();
                    return {};
                }
                context_internal<string_type> render_ctx{ctx.ctx}; // start a new line_buffer
                const auto str = tmpl.render(render_ctx);
                if (!tmpl.is_valid()) {
                    error_message_ = tmpl.error_message();
                    return {};
                }
                bool do_escape = false;
                switch (escape) {
                    case render_lambda_escape::escape:
                        do_escape = true;
                        break;
                    case render_lambda_escape::unescape:
                        do_escape = false;
                        break;
                    case render_lambda_escape::optional:
                        do_escape = escaped;
                        break;
                }
                return do_escape ? escape_(str) : str;
            };
            if (parse_with_same_context) {
                basic_mustache tmpl{text, ctx};
                tmpl.set_custom_escape(escape_);
                return process_template(tmpl);
            }
            basic_mustache tmpl{text};
            tmpl.set_custom_escape(escape_);
            return process_template(tmpl);
        };
        const typename basic_renderer<string_type>::type1 render = [&render2](const string_type& text) {
            return render2(text, false);
        };
        if (var->is_lambda2()) {
            const basic_renderer<string_type> renderer{render, render2};
            render_result(ctx, var->lambda2_value()(text, renderer));
        } else {
            render_current_line(handler, ctx, nullptr);
            render_result(ctx, render(var->lambda_value()(text)));
        }
        return error_message_.empty();
    }